

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDofsImport.cpp
# Opt level: O3

bool iDynTree::dofsListFromURDFString
               (string *urdf_string,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dofs)

{
  bool bVar1;
  int iVar2;
  Model *pMVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  ModelLoader loader;
  Model model;
  ModelLoader local_190;
  undefined1 local_188 [40];
  string local_160 [9];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(dofs,0);
  ModelLoader::ModelLoader(&local_190);
  local_160[0]._M_dataplus._M_p = (pointer)&local_160[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"urdf","");
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_188._16_8_ = (pointer)0x0;
  bVar1 = ModelLoader::loadModelFromString
                    (&local_190,urdf_string,local_160,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160[0]._M_dataplus._M_p != &local_160[0].field_2) {
    operator_delete(local_160[0]._M_dataplus._M_p,local_160[0].field_2._M_allocated_capacity + 1);
  }
  pMVar3 = ModelLoader::model(&local_190);
  iDynTree::Model::Model((Model *)local_160,pMVar3);
  uVar6 = 0;
  while( true ) {
    uVar4 = iDynTree::Model::getNrOfJoints();
    if (uVar4 <= uVar6) break;
    plVar5 = (long *)iDynTree::Model::getJoint((long)local_160);
    iVar2 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (iVar2 != 0) {
      iDynTree::Model::getJointName_abi_cxx11_((long)local_188);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dofs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
      }
    }
    uVar6 = uVar6 + 1;
  }
  iDynTree::Model::~Model((Model *)local_160);
  ModelLoader::~ModelLoader(&local_190);
  return bVar1;
}

Assistant:

bool dofsListFromURDFString(const std::string & urdf_string,
                            std::vector<std::string>& dofs)
{
    // clear the vector
    dofs.resize(0);

    // Load a iDynTree::Model and dump the dofs name in the vector

    ModelLoader loader;
    bool ok = loader.loadModelFromString(urdf_string);
    iDynTree::Model model = loader.model();

    for(size_t jnt = 0; jnt < model.getNrOfJoints(); jnt++)
    {
        if( model.getJoint(jnt)->getNrOfDOFs() > 0 )
        {
            dofs.push_back(model.getJointName(jnt));
        }
    }

    return ok;
}